

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha.cc
# Opt level: O1

bool __thiscall sshash::sha::digest(sha *this,string *out,char *str,uint n)

{
  EVP_MD *type;
  EVP_MD_CTX *ctx;
  uint i;
  long lVar1;
  bool bVar2;
  uchar md_out [64];
  undefined1 local_78 [72];
  
  if (str == (char *)0x0) {
    bVar2 = false;
  }
  else {
    type = (EVP_MD *)EVP_shake128();
    bVar2 = type != (EVP_MD *)0x0;
    if (bVar2) {
      ctx = (EVP_MD_CTX *)EVP_MD_CTX_new();
      lVar1 = 0;
      EVP_DigestInit_ex(ctx,type,(ENGINE *)0x0);
      EVP_DigestUpdate(ctx,str,(ulong)n);
      EVP_DigestFinalXOF(ctx,local_78,8);
      EVP_MD_CTX_free(ctx);
      do {
        lVar1 = lVar1 + 1;
      } while (lVar1 != 8);
      out->_M_string_length = 0;
      *(out->_M_dataplus)._M_p = '\0';
      std::__cxx11::string::push_back((char)out);
      if (out->_M_string_length < (ulong)this->_abbrev) {
        do {
          std::__cxx11::string::push_back((char)out);
        } while (out->_M_string_length < (ulong)this->_abbrev);
      }
    }
  }
  return bVar2;
}

Assistant:

bool sha::digest(std::string &out, const char *str, unsigned int n)
{
	if (!str)
		return false;

	unsigned char md_out[EVP_MAX_MD_SIZE];
	const int md_len = 8;

#ifdef SN_shake128
	// Use SHAKE128 with 8 byte digest length
	const EVP_MD *md = EVP_shake128();
	if (!md)
		return false;

	EVP_MD_CTX *mdctx = EVP_MD_CTX_new();
	EVP_DigestInit_ex(mdctx, md, NULL);
	EVP_DigestUpdate(mdctx, str, n);

	EVP_DigestFinalXOF(mdctx, md_out, md_len);

	EVP_MD_CTX_free(mdctx);
#else
	SHA512((const unsigned char *)str, n, md_out);
#endif

	// Convert digest into uint64
	uint64_t d = 0;
	for (unsigned int i = 0; i < md_len; i++)
		d = (d << 8) | md_out[i];

	// Convert into alpha-numeric string
	out.clear();

	// First char is generated using only the basemap to ensure the hash str
	// never starts with a digit.
	out += _map[d % BASE_MAPSIZE];
	d /= BASE_MAPSIZE;

	for (; out.size() < _abbrev; d /= FULL_MAPSIZE)
		out += _map[d % FULL_MAPSIZE];

	return true;
}